

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlp_util.cc
# Opt level: O3

CtrlPMatchMode __thiscall cpsm::parse_ctrlp_match_mode(cpsm *this,string_ref mmode)

{
  CtrlPMatchMode CVar1;
  int iVar2;
  Error *this_00;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  basic_string_ref<char,_std::char_traits<char>_> args_1;
  
  pcVar5 = mmode.ptr_;
  if ((long)pcVar5 < 0xd) {
    CVar1 = FULL_LINE;
    if (pcVar5 == (char *)0x0) {
      return FULL_LINE;
    }
    if (pcVar5 != (char *)0x9) goto LAB_0010d20d;
    uVar3 = *(ulong *)this ^ 0x6e696c2d6c6c7566;
    uVar4 = (ulong)(byte)this[8] ^ 0x65;
  }
  else {
    if (pcVar5 != (char *)0xd) {
      if ((pcVar5 == (char *)0xe) && (iVar2 = bcmp(this,"until-last-tab",0xe), iVar2 == 0)) {
        return UNTIL_LAST_TAB;
      }
      goto LAB_0010d20d;
    }
    iVar2 = bcmp(this,"filename-only",0xd);
    if (iVar2 == 0) {
      return FILENAME_ONLY;
    }
    uVar3 = *(ulong *)this ^ 0x6f6e2d7473726966;
    uVar4 = *(ulong *)(this + 5) ^ 0x6261742d6e6f6e2d;
    CVar1 = FIRST_NON_TAB;
  }
  if (uVar4 == 0 && uVar3 == 0) {
    return CVar1;
  }
LAB_0010d20d:
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  args_1.len_ = (size_t)pcVar5;
  args_1.ptr_ = (char *)this;
  Error::Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>>
            (this_00,"unknown match mode ",args_1);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

CtrlPMatchMode parse_ctrlp_match_mode(boost::string_ref const mmode) {
  if (mmode.empty() || mmode == "full-line") {
    return CtrlPMatchMode::FULL_LINE;
  } else if (mmode == "filename-only") {
    return CtrlPMatchMode::FILENAME_ONLY;
  } else if (mmode == "first-non-tab") {
    return CtrlPMatchMode::FIRST_NON_TAB;
  } else if (mmode == "until-last-tab") {
    return CtrlPMatchMode::UNTIL_LAST_TAB;
  }
  throw Error("unknown match mode ", mmode);
}